

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O2

int is_nontrans_global_motion(MACROBLOCKD *xd,MB_MODE_INFO *mbmi)

{
  MV_REFERENCE_FRAME *pMVar1;
  byte bVar2;
  long lVar3;
  
  if ((mbmi->mode == '\x17') || (mbmi->mode == '\x0f')) {
    bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
            [mbmi->bsize];
    if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[mbmi->bsize] <
        "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[mbmi->bsize]) {
      bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [mbmi->bsize];
    }
    if (1 < bVar2) {
      lVar3 = 0;
      do {
        if ((ulong)('\0' < mbmi->ref_frame[1]) + 1 == lVar3) {
          return 1;
        }
        pMVar1 = mbmi->ref_frame + lVar3;
        lVar3 = lVar3 + 1;
      } while (xd->global_motion[*pMVar1].wmtype != '\x01');
    }
  }
  return 0;
}

Assistant:

static inline int is_nontrans_global_motion(const MACROBLOCKD *xd,
                                            const MB_MODE_INFO *mbmi) {
  int ref;

  // First check if all modes are GLOBALMV
  if (mbmi->mode != GLOBALMV && mbmi->mode != GLOBAL_GLOBALMV) return 0;

  if (AOMMIN(mi_size_wide[mbmi->bsize], mi_size_high[mbmi->bsize]) < 2)
    return 0;

  // Now check if all global motion is non translational
  for (ref = 0; ref < 1 + has_second_ref(mbmi); ++ref) {
    if (xd->global_motion[mbmi->ref_frame[ref]].wmtype == TRANSLATION) return 0;
  }
  return 1;
}